

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::doHidePopup(QComboBoxPrivate *this)

{
  QWidget *this_00;
  bool bVar1;
  
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&this->container);
  if ((bVar1) &&
     (this_00 = (QWidget *)(this->container).wp.value,
     (this_00->data->widget_attributes & 0x8000) != 0)) {
    QWidget::hide(this_00);
  }
  resetButton(this);
  return;
}

Assistant:

void QComboBoxPrivate::doHidePopup()
{
    if (container && container->isVisible())
        container->hide();

    resetButton();
}